

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O3

void rhash_sha1_update(sha1_ctx *ctx,uchar *msg,size_t size)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t __n;
  sha1_ctx *block;
  ulong uVar9;
  sha1_ctx *__src;
  bool bVar10;
  
  uVar1 = ctx->length;
  ctx->length = uVar1 + size;
  if ((uVar1 & 0x3f) != 0) {
    uVar9 = (ulong)(0x40 - ((uint)uVar1 & 0x3f));
    __n = size;
    if (uVar9 < size) {
      __n = uVar9;
    }
    memcpy(ctx->message + ((uint)uVar1 & 0x3f),msg,__n);
    bVar10 = size < uVar9;
    size = size - uVar9;
    if (bVar10) {
      return;
    }
    rhash_sha1_process_block(ctx->hash,(uint *)ctx);
    msg = msg + uVar9;
  }
  __src = (sha1_ctx *)msg;
  if (0x3f < size) {
    do {
      block = __src;
      if (((ulong)msg & 3) != 0) {
        uVar2 = *(undefined8 *)__src->message;
        uVar3 = *(undefined8 *)(__src->message + 8);
        uVar4 = *(undefined8 *)(__src->message + 0x10);
        uVar5 = *(undefined8 *)(__src->message + 0x18);
        uVar6 = *(undefined8 *)(__src->message + 0x20);
        uVar7 = *(undefined8 *)(__src->message + 0x28);
        uVar8 = *(undefined8 *)(__src->message + 0x38);
        *(undefined8 *)(ctx->message + 0x30) = *(undefined8 *)(__src->message + 0x30);
        *(undefined8 *)(ctx->message + 0x38) = uVar8;
        *(undefined8 *)(ctx->message + 0x20) = uVar6;
        *(undefined8 *)(ctx->message + 0x28) = uVar7;
        *(undefined8 *)(ctx->message + 0x10) = uVar4;
        *(undefined8 *)(ctx->message + 0x18) = uVar5;
        *(undefined8 *)ctx->message = uVar2;
        *(undefined8 *)(ctx->message + 8) = uVar3;
        block = ctx;
      }
      rhash_sha1_process_block(ctx->hash,(uint *)block);
      __src = (sha1_ctx *)&__src->length;
      size = size - 0x40;
    } while (0x3f < size);
  }
  if (size == 0) {
    return;
  }
  memcpy(ctx,__src,size);
  return;
}

Assistant:

void rhash_sha1_update(sha1_ctx *ctx, const unsigned char* msg, size_t size)
{
	unsigned index = (unsigned)ctx->length & 63;
	ctx->length += size;

	/* fill partial block */
	if (index) {
		unsigned left = sha1_block_size - index;
		memcpy(ctx->message + index, msg, (size < left ? size : left));
		if (size < left) return;

		/* process partial block */
		rhash_sha1_process_block(ctx->hash, (unsigned*)ctx->message);
		msg  += left;
		size -= left;
	}
	while (size >= sha1_block_size) {
		unsigned* aligned_message_block;
		if (IS_ALIGNED_32(msg)) {
			/* the most common case is processing of an already aligned message
			without copying it */
			aligned_message_block = (unsigned*)msg;
		} else {
			memcpy(ctx->message, msg, sha1_block_size);
			aligned_message_block = (unsigned*)ctx->message;
		}

		rhash_sha1_process_block(ctx->hash, aligned_message_block);
		msg  += sha1_block_size;
		size -= sha1_block_size;
	}
	if (size) {
		/* save leftovers */
		memcpy(ctx->message, msg, size);
	}
}